

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

int __thiscall
btLemkeAlgorithm::findLexicographicMinimum(btLemkeAlgorithm *this,btMatrixXf *A,int *pivotColIndex)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  float *pfVar4;
  btMatrixX<float> *in_RSI;
  float fVar5;
  int ii;
  btVectorXf test;
  int j_1;
  int i;
  int j;
  btScalar a;
  btVectorXf vec;
  int row;
  btAlignedObjectArray<btVectorX<float>_> Rows;
  int dim;
  int RowIndex;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  btAlignedObjectArray<btVectorX<float>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  int local_b0;
  int local_ac;
  int local_84;
  int local_80;
  int local_7c;
  int local_44;
  btAlignedObjectArray<btVectorX<float>_> local_40;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = btMatrixX<float>::rows(in_RSI);
  btAlignedObjectArray<btVectorX<float>_>::btAlignedObjectArray
            ((btAlignedObjectArray<btVectorX<float>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  for (local_44 = 0; local_44 < local_20; local_44 = local_44 + 1) {
    btVectorX<float>::btVectorX
              ((btVectorX<float> *)in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c);
    btVectorX<float>::setZero
              ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    btAlignedObjectArray<btVectorX<float>_>::push_back
              (in_stack_fffffffffffffe80,
               (btVectorX<float> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pfVar4 = btMatrixX<float>::operator()
                       ((btMatrixX<float> *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    fVar5 = *pfVar4;
    if (0.0 < fVar5) {
      pfVar4 = btMatrixX<float>::operator()
                         ((btMatrixX<float> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      fVar1 = *pfVar4;
      btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_44);
      pfVar4 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe6c);
      *pfVar4 = fVar1 / fVar5;
      pfVar4 = btMatrixX<float>::operator()
                         ((btMatrixX<float> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      fVar1 = *pfVar4;
      btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_44);
      pfVar4 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe6c);
      *pfVar4 = fVar1 / fVar5;
      for (local_7c = 2; local_7c < local_20 + 1; local_7c = local_7c + 1) {
        pfVar4 = btMatrixX<float>::operator()
                           ((btMatrixX<float> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
        fVar1 = *pfVar4;
        btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_44);
        pfVar4 = btVectorX<float>::operator[]
                           ((btVectorX<float> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c);
        *pfVar4 = fVar1 / fVar5;
      }
    }
    btVectorX<float>::~btVectorX((btVectorX<float> *)0x265ea7);
  }
  local_80 = 0;
  do {
    iVar3 = btAlignedObjectArray<btVectorX<float>_>::size(&local_40);
    if (iVar3 <= local_80) {
LAB_002661cb:
      btAlignedObjectArray<btVectorX<float>_>::~btAlignedObjectArray
                ((btAlignedObjectArray<btVectorX<float>_> *)0x2661ee);
      return local_1c;
    }
    btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_80);
    fVar5 = btVectorX<float>::nrm2
                      ((btVectorX<float> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_84 = in_stack_fffffffffffffe70;
    if (0.0 < fVar5) {
      for (local_84 = 0; iVar3 = btAlignedObjectArray<btVectorX<float>_>::size(&local_40),
          local_84 < iVar3; local_84 = local_84 + 1) {
        if (local_80 != local_84) {
          btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_84);
          fVar5 = btVectorX<float>::nrm2
                            ((btVectorX<float> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          if (0.0 < fVar5) {
            btVectorX<float>::btVectorX
                      ((btVectorX<float> *)in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c)
            ;
            for (local_ac = 0; local_ac < local_20 + 1; local_ac = local_ac + 1) {
              btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_84);
              pfVar4 = btVectorX<float>::operator[]
                                 ((btVectorX<float> *)
                                  CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
              in_stack_fffffffffffffe94 = *pfVar4;
              btAlignedObjectArray<btVectorX<float>_>::operator[](&local_40,local_80);
              pfVar4 = btVectorX<float>::operator[]
                                 ((btVectorX<float> *)
                                  CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
              in_stack_fffffffffffffe7c = in_stack_fffffffffffffe94 - *pfVar4;
              in_stack_fffffffffffffe80 =
                   (btAlignedObjectArray<btVectorX<float>_> *)
                   btVectorX<float>::operator[]
                             ((btVectorX<float> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe6c);
              *(float *)in_stack_fffffffffffffe80 = in_stack_fffffffffffffe7c;
            }
            bVar2 = LexicographicPositive
                              ((btLemkeAlgorithm *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                               (btVectorXf *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
            in_stack_fffffffffffffe78 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe78);
            if (bVar2) {
              local_b0 = 0;
            }
            else {
              local_b0 = 0xb;
            }
            btVectorX<float>::~btVectorX((btVectorX<float> *)0x266145);
            if (local_b0 != 0) break;
          }
        }
      }
      in_stack_fffffffffffffe74 = btAlignedObjectArray<btVectorX<float>_>::size(&local_40);
      if (local_84 == in_stack_fffffffffffffe74) {
        local_1c = local_80 + local_1c;
        goto LAB_002661cb;
      }
    }
    local_80 = local_80 + 1;
    in_stack_fffffffffffffe70 = local_84;
  } while( true );
}

Assistant:

int btLemkeAlgorithm::findLexicographicMinimum(const btMatrixXu& A, const int & pivotColIndex) {
	  int RowIndex = 0;
	  int dim = A.rows();
	  btAlignedObjectArray<btVectorXu> Rows;
	  for (int row = 0; row < dim; row++) 
	  {

		  btVectorXu vec(dim + 1);
		  vec.setZero();//, INIT, 0.)
		  Rows.push_back(vec);
		  btScalar a = A(row, pivotColIndex);
		  if (a > 0) {
			  Rows[row][0] = A(row, 2 * dim + 1) / a;
			  Rows[row][1] = A(row, 2 * dim) / a;
			  for (int j = 2; j < dim + 1; j++)
				  Rows[row][j] = A(row, j - 1) / a;

#ifdef BT_DEBUG_OSTREAM
		//		if (DEBUGLEVEL) {
			//	  cout << "Rows(" << row << ") = " << Rows[row] << endl;
				// }
#endif 
		  }
	  }

	  for (int i = 0; i < Rows.size(); i++) 
	  {
		  if (Rows[i].nrm2() > 0.) {

			  int j = 0;
			  for (; j < Rows.size(); j++) 
			  {
				  if(i != j)
				  {
					  if(Rows[j].nrm2() > 0.)
					  {
						  btVectorXu test(dim + 1);
						  for (int ii=0;ii<dim+1;ii++)
						  {
							  test[ii] = Rows[j][ii] - Rows[i][ii];
						  }

						  //=Rows[j] - Rows[i]
						  if (! LexicographicPositive(test))
							  break;
					  }
				  }
			  }

			  if (j == Rows.size()) 
			  {
				  RowIndex += i;
				  break;
			  }
		  }
	  }

	  return RowIndex;
  }